

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O1

BufferWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateBuffer
          (BufferWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,
          VkBufferCreateInfo *BufferCI,char *DebugName)

{
  string msg;
  string local_48;
  
  if (BufferCI->sType != VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO) {
    Diligent::FormatString<char[26],char[55]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"BufferCI.sType == VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO",
               (char (*) [55])DebugName);
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"CreateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0xbf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  CreateVulkanObject<VkBuffer_T*,(VulkanUtilities::VulkanHandleTypeId)2,VkResult(*)(VkDevice_T*,VkBufferCreateInfo_const*,VkAllocationCallbacks_const*,VkBuffer_T**),VkBufferCreateInfo>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkBufferCreateInfo_ptr_VkAllocationCallbacks_ptr_VkBuffer_T_ptr_ptr
              *)vkCreateBuffer,BufferCI,DebugName,"buffer");
  return __return_storage_ptr__;
}

Assistant:

BufferWrapper VulkanLogicalDevice::CreateBuffer(const VkBufferCreateInfo& BufferCI,
                                                const char*               DebugName) const
{
    VERIFY_EXPR(BufferCI.sType == VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO);
    return CreateVulkanObject<VkBuffer, VulkanHandleTypeId::Buffer>(vkCreateBuffer, BufferCI, DebugName, "buffer");
}